

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

string * anon_unknown.dwarf_a15f78::TargetId
                   (string *__return_storage_ptr__,cmGeneratorTarget *gt,string *topBuild)

{
  cmLocalGenerator *this;
  string *psVar1;
  cmCryptoHash hasher;
  string hash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string path;
  
  cmCryptoHash::cmCryptoHash(&hasher,AlgoSHA3_256);
  this = cmGeneratorTarget::GetLocalGenerator(gt);
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this);
  RelativeIfUnder(&path,topBuild,psVar1);
  cmCryptoHash::HashString(&hash,&hasher,&path);
  std::__cxx11::string::resize((ulong)&hash,'\x14');
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
  std::operator+(&local_58,psVar1,"::@");
  std::operator+(__return_storage_ptr__,&local_58,&hash);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&hash);
  std::__cxx11::string::~string((string *)&path);
  cmCryptoHash::~cmCryptoHash(&hasher);
  return __return_storage_ptr__;
}

Assistant:

std::string TargetId(cmGeneratorTarget const* gt, std::string const& topBuild)
{
  cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_256);
  std::string path = RelativeIfUnder(
    topBuild, gt->GetLocalGenerator()->GetCurrentBinaryDirectory());
  std::string hash = hasher.HashString(path);
  hash.resize(20, '0');
  return gt->GetName() + CMAKE_DIRECTORY_ID_SEP + hash;
}